

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result spvc_compiler_set_entry_point(spvc_compiler compiler,char *name,SpvExecutionModel model)

{
  Compiler *this;
  allocator local_61;
  string local_60 [2];
  
  this = (compiler->compiler)._M_t.
         super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>.
         _M_t.
         super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
         .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)local_60,name,&local_61);
  spirv_cross::Compiler::set_entry_point(this,local_60,model);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60[0]._M_dataplus._M_p != &local_60[0].field_2) {
    operator_delete(local_60[0]._M_dataplus._M_p);
  }
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_set_entry_point(spvc_compiler compiler, const char *name, SpvExecutionModel model)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		compiler->compiler->set_entry_point(name, static_cast<spv::ExecutionModel>(model));
	}